

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

void voc_parse_np(voccxdef *ctx)

{
  short *psVar1;
  ushort uVar2;
  ushort uVar3;
  runcxdef *ctx_00;
  runsdef *prVar4;
  voccxdef *pvVar5;
  uint uVar6;
  uint uVar7;
  vocoldef *pvVar8;
  char *__dest;
  char **cmd;
  uchar *puVar9;
  int32_t tmp;
  uint uVar10;
  ulong uVar11;
  uint siz;
  uint siz_00;
  char **ppcVar12;
  vocoldef *pvVar13;
  int32_t tmp_2;
  long lVar14;
  ulong uVar15;
  vocoldef *pvVar16;
  int32_t tmp_1;
  undefined8 uVar17;
  char **ppcVar18;
  ulong uVar19;
  objnum *poVar20;
  uint16_t tmp_3;
  uint siz_01;
  int iVar21;
  uint uVar22;
  bool bVar23;
  ushort *local_b8;
  uint local_b0;
  int next;
  voccxdef *local_a8;
  long local_a0;
  int local_98;
  int local_94;
  runcxdef *local_90;
  undefined8 local_88;
  int *local_80;
  ushort *local_78;
  ushort *local_70;
  undefined8 local_68;
  uchar *local_60;
  vocoldef *local_58;
  int no_match;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ctx_00 = ctx->voccxrun;
  puVar9 = ctx->voc_stk_cur;
  pvVar8 = (vocoldef *)voc_stk_alo(ctx,8000);
  local_48._0_4_ = ctx->voccxunknown;
  local_48._4_4_ = ctx->voccxlastunk;
  uStack_40 = 0;
  ctx->voccxunknown = 0;
  ctx->voccxlastunk = 0;
  prVar4 = ctx_00->runcxsp;
  ctx_00->runcxsp = prVar4 + -1;
  if (prVar4[-1].runstyp != '\a') {
LAB_001f8220:
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx_00,0x3fc);
  }
  local_b8 = (ushort *)prVar4[-1].runsv.runsvstr;
  uVar2 = *local_b8;
  ctx_00->runcxsp = prVar4 + -2;
  local_58 = pvVar8;
  if (prVar4[-2].runstyp != '\a') goto LAB_001f8220;
  local_70 = (ushort *)prVar4[-2].runsv.runsvstr;
  uVar3 = *local_70;
  ctx_00->runcxsp = prVar4 + -3;
  if (prVar4[-3].runstyp != '\x01') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx_00,0x3eb);
  }
  next = *(int *)&prVar4[-3].runsv + -1;
  ctx_00->runcxsp = prVar4 + -4;
  if (prVar4[-4].runstyp == '\x05') {
    iVar21 = 0;
LAB_001f7e0b:
    ctx_00->runcxsp = prVar4 + -5;
    if (prVar4[-5].runstyp == '\x05') {
      uVar17 = 0;
    }
    else {
      uVar17 = 1;
      if (prVar4[-5].runstyp != '\b') goto LAB_001f7e24;
    }
    ctx_00->runcxsp = prVar4 + -6;
    local_a8 = ctx;
    local_98 = iVar21;
    local_94 = next;
    local_90 = ctx_00;
    local_68 = uVar17;
    local_60 = puVar9;
    if (prVar4[-6].runstyp == '\x05') {
      local_88 = 0;
    }
    else {
      local_88 = 1;
      if (prVar4[-6].runstyp != '\b') {
        ctx_00->runcxerr->errcxptr->erraac = 0;
        goto LAB_001f7e7e;
      }
    }
    uVar22 = uVar2 - 2;
    local_b8 = local_b8 + 1;
    local_70 = local_70 + 1;
    local_a0 = 0;
    siz_01 = 4;
    siz = 8;
    siz_00 = 0;
    local_b0 = uVar22;
    local_78 = local_b8;
    while (pvVar5 = local_a8, local_b0 != 0) {
      if ((char)*local_b8 == '\x03') {
        siz_00 = siz_00 + *(ushort *)((long)local_b8 + 1) + 1;
      }
      lstadv((uchar **)&local_b8,&local_b0);
      local_a0 = local_a0 + 1;
      siz_01 = siz_01 + 4;
      siz = siz + 8;
    }
    __dest = (char *)voc_stk_alo(local_a8,siz_00);
    cmd = (char **)voc_stk_alo(pvVar5,siz);
    local_80 = (int *)voc_stk_alo(local_a8,siz_01);
    local_b8 = local_78;
    iVar21 = 0;
    local_b0 = uVar22;
    while (pvVar5 = local_a8, local_b0 != 0) {
      if ((char)*local_b8 == '\x03') {
        cmd[iVar21] = __dest;
        uVar2 = *(ushort *)((long)local_b8 + 1);
        uVar11 = (ulong)(uVar2 - 2);
        memcpy(__dest,(char *)((long)local_b8 + 3),uVar11);
        __dest[uVar11] = '\0';
        __dest = __dest + (uVar2 - 1);
        iVar21 = iVar21 + 1;
      }
      lstadv((uchar **)&local_b8,&local_b0);
    }
    cmd[iVar21] = (char *)0x0;
    local_b8 = local_70;
    iVar21 = 0;
    local_b0 = uVar3 - 2;
    while ((pvVar8 = local_58, local_b0 != 0 && (iVar21 < (int)local_a0))) {
      if ((char)*local_b8 == '\x01') {
        local_80[iVar21] = *(int *)((long)local_b8 + 1);
        iVar21 = iVar21 + 1;
      }
      lstadv((uchar **)&local_b8,&local_b0);
    }
    uVar7 = vocgobj(pvVar5,cmd,local_80,local_94,&next,local_98,local_58,(int)local_68,(int)local_88
                    ,&no_match);
    pvVar5->voccxunknown = (undefined4)local_48;
    pvVar5->voccxlastunk = local_48._4_4_;
    if ((int)uVar7 < 0) {
      runpnil(local_90);
    }
    else if (uVar7 == 0) {
      next = next + 1;
      voc_push_numlist(pvVar5,(uint *)&next,1);
    }
    else {
      iVar21 = 0;
      uVar10 = 0;
      while ((int)uVar10 < (int)uVar7) {
        ppcVar12 = &pvVar8[(int)uVar10].vocolfst;
        ppcVar18 = ppcVar12;
        for (lVar14 = 0; uVar6 = uVar7, (long)(int)uVar10 - (ulong)uVar7 != lVar14;
            lVar14 = lVar14 + -1) {
          if (*ppcVar18 != *ppcVar12) {
            uVar6 = uVar10 - (int)lVar14;
            break;
          }
          iVar21 = iVar21 + (uint)(((vocoldef *)(ppcVar18 + -1))->vocolobj != 0xffff) * 2 + 6;
          ppcVar18 = ppcVar18 + 5;
        }
        uVar10 = uVar6;
        iVar21 = iVar21 + 0xd;
      }
      local_b0 = iVar21 + 5;
      puVar9 = voc_push_list_siz(pvVar5,local_b0);
      *puVar9 = '\x01';
      *(int *)(puVar9 + 1) = next + 1;
      local_b8 = (ushort *)(puVar9 + 5);
      uVar11 = 0;
      while ((int)uVar11 < (int)uVar7) {
        psVar1 = (short *)((long)local_b8 + 1);
        *(uchar *)local_b8 = '\a';
        uVar11 = (ulong)(int)uVar11;
        pvVar13 = pvVar8 + uVar11;
        uVar15 = 0;
        uVar19 = 0xffffffff;
        lVar14 = local_a0;
        do {
          iVar21 = (int)uVar19;
          bVar23 = lVar14 == 0;
          lVar14 = lVar14 + -1;
          if (bVar23) {
            uVar15 = 0;
            break;
          }
          ppcVar18 = cmd + uVar15;
          if (*ppcVar18 == pvVar13->vocolfst) {
            uVar19 = uVar15 & 0xffffffff;
          }
          iVar21 = (int)uVar19;
          uVar15 = uVar15 + 1;
        } while (*ppcVar18 != pvVar13->vocollst);
        *(uchar *)((long)local_b8 + 3) = '\x01';
        *(int *)(local_b8 + 2) = iVar21 + 1;
        *(uchar *)(local_b8 + 4) = '\x01';
        *(int *)((long)local_b8 + 9) = (int)uVar15;
        local_b8 = (ushort *)((long)local_b8 + 0xd);
        pvVar16 = pvVar13;
        for (; (long)uVar11 < (long)(ulong)uVar7; uVar11 = uVar11 + 1) {
          if (pvVar16->vocolfst != pvVar13->vocolfst) goto LAB_001f81d8;
          poVar20 = (objnum *)((long)local_b8 + 1);
          if (pvVar16->vocolobj == 0xffff) {
            *(uchar *)local_b8 = '\x05';
          }
          else {
            *(uchar *)local_b8 = '\x02';
            *poVar20 = pvVar16->vocolobj;
            poVar20 = (objnum *)((long)local_b8 + 3);
          }
          *(uchar *)poVar20 = '\x01';
          *(int *)((long)poVar20 + 1) = pvVar13->vocolflg;
          local_b8 = (ushort *)((long)poVar20 + 5);
          pvVar16 = pvVar16 + 1;
        }
        uVar11 = (ulong)uVar7;
LAB_001f81d8:
        *psVar1 = (short)local_b8 - (short)psVar1;
      }
    }
    pvVar5->voc_stk_cur = local_60;
    return;
  }
  iVar21 = 1;
  if (prVar4[-4].runstyp == '\b') goto LAB_001f7e0b;
LAB_001f7e24:
  ctx_00->runcxerr->errcxptr->erraac = 0;
LAB_001f7e7e:
  runsign(ctx_00,0x3ed);
}

Assistant:

void voc_parse_np(voccxdef *ctx)
{
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *objlist;
    uchar *save_sp;
    uchar *wordp;
    uint wordsiz;
    uchar *typp;
    uint typsiz;
    int cnt;
    char **wordarr;
    int wordcnt;
    char *wordchararr;
    uint wordcharsiz;
    int *typarr;
    int complain;
    int chkact;
    int multi;
    int no_match;
    int next;
    int cur;
    uchar *lstp;
    uint lstsiz;
    char *p;
    int i;
    int old_unknown, old_lastunk;

    /* allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, objlist);

    /* 
     *   Save the original context unknown values, since we don't want to
     *   affect the context information in this game-initiated call, then
     *   clear the unknown word count for the duration of the call.  
     */
    old_unknown = ctx->voccxunknown;
    old_lastunk = ctx->voccxlastunk;
    ctx->voccxunknown = ctx->voccxlastunk = 0;

    /* get the list of words, and read its length prefix */
    wordp = runpoplst(rcx);
    wordsiz = osrp2(wordp) - 2;
    wordp += 2;

    /* get the list of types, and read its length prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* get the starting index (adjusting for zero-based indexing) */
    cur = runpopnum(rcx) - 1;
    next = cur;

    /* get the flag arguments */
    complain = runpoplog(rcx);
    multi = runpoplog(rcx);
    chkact = runpoplog(rcx);

    /* count the words in the word list */
    for (wordcnt = 0, lstp = wordp, wordcharsiz = 0, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* count the word */
        ++wordcnt;

        /* 
         *   count the space needed for the word - count the bytes of the
         *   string plus a null terminator 
         */
        if (*lstp == DAT_SSTRING)
            wordcharsiz += osrp2(lstp+1) + 1;
    }

    /* allocate space for the word arrays */
    VOC_STK_ARRAY(ctx, char,   wordchararr, wordcharsiz);
    VOC_STK_ARRAY(ctx, char *, wordarr,     wordcnt+1);
    VOC_STK_ARRAY(ctx, int,    typarr,      wordcnt+1);

    /* build the word array */
    for (i = 0, p = wordchararr, lstp = wordp, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* add the word to the word array */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* add this entry to the word array */
            wordarr[i] = p;

            /* copy the word to the character array and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the write pointer past this entry */
            p += len + 1;

            /* bump the index */
            ++i;
        }
    }

    /* store an empty last entry */
    wordarr[i] = 0;

    /* build the type array */
    for (i = 0, lstp = typp, lstsiz = typsiz ;
         lstsiz != 0 && i < wordcnt ; lstadv(&lstp, &lstsiz))
    {
        /* add this entry to the type array */
        if (*lstp == DAT_NUMBER)
        {
            /* set the entry */
            typarr[i] = (int)osrp4(lstp + 1);

            /* bump the index */
            ++i;
        }
    }

    /* parse the noun phrase */
    cnt = vocgobj(ctx, wordarr, typarr, cur, &next, complain, objlist,
                  multi, chkact, &no_match);

    /* restore context unknown values */
    ctx->voccxunknown = old_unknown;
    ctx->voccxlastunk = old_lastunk;

    /* check the return value */
    if (cnt < 0)
    {
        /* syntax error; return nil to indicate an error */
        runpnil(rcx);
    }
    else if (cnt == 0)
    {
        /* 
         *   No objects found.  Return a list consisting only of the next
         *   index.  If the next index is equal to the starting index,
         *   this will tell the caller that no noun phrase is
         *   syntactically present; otherwise, it will tell the caller
         *   that a noun phrase is present but there are no matching
         *   objects.
         *   
         *   Note that we must increment the returned element index to
         *   conform with the 1-based index values that the game function
         *   uses.  
         */
        ++next;
        voc_push_numlist(ctx, (uint *)&next, 1);
    }
    else
    {
        /*
         *   We found one or more objects.  Return a list whose first
         *   element is the index of the next word to be parsed, and whose
         *   remaining elements are sublists.  Each sublist contains a
         *   match for one noun phrase; for each AND adding another noun
         *   phrase, there's another sublist.  Each sublist contains the
         *   index of the first word of its noun phrase, the index of the
         *   last word of its noun phrase, and then the objects.  For each
         *   object, there is a pair of entries: the object itself, and
         *   the flags for the object.
         *   
         *   First, figure out how much space we need by scanning the
         *   return list.  
         */
        for (lstsiz = 0, i = 0 ; i < cnt ; )
        {
            int j;

            /* 
             *   count the entries in this sublist by looking for the next
             *   entry whose starting word is different 
             */
            for (j = i ;
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* 
                 *   for this entry, we need space for the object (1 + 2
                 *   for an object, or just 1 for nil) and flags (1 + 4) 
                 */
                if (objlist[j].vocolobj == MCMONINV)
                    lstsiz += 1;
                else
                    lstsiz += 3;
                lstsiz += 5;
            }

            /* 
             *   For this sublist, we need space for the first index (type
             *   prefix + number = 1 + 4 = 5) and the last index (5).
             *   We've already counted space for the objects in the list.
             *   Finally, we need space for the list type and length
             *   prefixes (1 + 2) for the sublist itself.  
             */
            lstsiz += (5 + 5) + 3;

            /* skip to the next element */
            i = j;
        }

        /* 
         *   finally, we need space for the first element of the list,
         *   which is the index of the next word to be parsed (1+4)
         */
        lstsiz += 5;

        /* allocate space for the list */
        lstp = voc_push_list_siz(ctx, lstsiz);

        /* 
         *   store the first element - the index of the next word to parse
         *   (adjusting to 1-based indexing) 
         */
        *lstp++ = DAT_NUMBER;
        oswp4s(lstp, next + 1);
        lstp += 4;

        /* build the list */
        for (i = 0 ; i < cnt ; )
        {
            uchar *sublstp;
            int j;
            int firstidx = -1;
            int lastidx = -1;

            /* store the list type prefix */
            *lstp++ = DAT_LIST;

            /* 
             *   remember where the length prefix is, then skip it - we'll
             *   come back and fill it in when we're done with the sublist 
             */
            sublstp = lstp;
            lstp += 2;

            /* search the array to find the indices of the boundary words */
            for (j = 0 ; j < wordcnt ; ++j)
            {
                /* if this is the first word, remember the index */
                if (wordarr[j] == objlist[i].vocolfst)
                    firstidx = j;

                /* if this is the last word, remember the index */
                if (wordarr[j] == objlist[i].vocollst)
                {
                    /* remember the index */
                    lastidx = j;

                    /* 
                     *   we can stop looking now, since the words are
                     *   always in order (so the first index will never be
                     *   after the last index) 
                     */
                    break;
                }
            }

            /* add the first and last index, adjusting to 1-based indexing */
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, firstidx + 1);
            lstp += 4;
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, lastidx + 1);
            lstp += 4;

            /* add the objects */
            for (j = i ; 
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* add this object */
                if (objlist[j].vocolobj == MCMONINV)
                {
                    /* just store a nil */
                    *lstp++ = DAT_NIL;
                }
                else
                {
                    /* store the object */
                    *lstp++ = DAT_OBJECT;
                    oswp2(lstp, objlist[j].vocolobj);
                    lstp += 2;
                }

                /* add the flags */
                *lstp++ = DAT_NUMBER;
                oswp4s(lstp, objlist[i].vocolflg);
                lstp += 4;
            }

            /* fix up the sublist's length prefix */
            oswp2(sublstp, lstp - sublstp);

            /* move on to the next sublist */
            i = j;
        }
    }

    /* exit the stack frame */
    voc_leave(ctx, save_sp);
}